

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O0

int __thiscall
gtl::internal_btree::
btree<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>
::erase_unique<S2CellId>
          (btree<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>
           *this,S2CellId *key)

{
  node_type *n;
  bool bVar1;
  iterator iter_00;
  btree_iterator<gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>,_std::pair<const_S2CellId,_S2ShapeIndexCell_*>_&,_std::pair<const_S2CellId,_S2ShapeIndexCell_*>_*>
  bVar2;
  undefined1 local_40 [12];
  btree_node<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>
  *local_30;
  iterator iter;
  S2CellId *key_local;
  btree<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>
  *this_local;
  
  iter._8_8_ = key;
  n = root(this);
  btree_iterator<gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>,_std::pair<const_S2CellId,_S2ShapeIndexCell_*>_&,_std::pair<const_S2CellId,_S2ShapeIndexCell_*>_*>
  ::btree_iterator((btree_iterator<gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>,_std::pair<const_S2CellId,_S2ShapeIndexCell_*>_&,_std::pair<const_S2CellId,_S2ShapeIndexCell_*>_*>
                    *)local_40,n,0);
  bVar2._12_4_ = 0;
  bVar2.node = (btree_node<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>
                *)local_40._0_8_;
  bVar2.position = local_40._8_4_;
  bVar2 = btree<gtl::internal_btree::map_params<S2CellId,S2ShapeIndexCell*,std::less<S2CellId>,std::allocator<std::pair<S2CellId_const,S2ShapeIndexCell*>>,256,false>>
          ::
          internal_find_unique<S2CellId,gtl::internal_btree::btree_iterator<gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2CellId,S2ShapeIndexCell*,std::less<S2CellId>,std::allocator<std::pair<S2CellId_const,S2ShapeIndexCell*>>,256,false>>,std::pair<S2CellId_const,S2ShapeIndexCell*>&,std::pair<S2CellId_const,S2ShapeIndexCell*>*>>
                    ((btree<gtl::internal_btree::map_params<S2CellId,S2ShapeIndexCell*,std::less<S2CellId>,std::allocator<std::pair<S2CellId_const,S2ShapeIndexCell*>>,256,false>>
                      *)this,key,bVar2);
  local_30 = bVar2.node;
  iter.node._0_4_ = bVar2.position;
  bVar1 = local_30 !=
          (btree_node<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>
           *)0x0;
  if (bVar1) {
    iter_00._12_4_ = 0;
    iter_00.node = (btree_node<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>
                    *)SUB128(bVar2._0_12_,0);
    iter_00.position = SUB124(bVar2._0_12_,8);
    erase(this,iter_00);
  }
  this_local._4_4_ = (uint)bVar1;
  return this_local._4_4_;
}

Assistant:

int btree<P>::erase_unique(const K &key) {
  iterator iter = internal_find_unique(key, iterator(root(), 0));
  if (!iter.node) {
    // The key doesn't exist in the tree, return nothing done.
    return 0;
  }
  erase(iter);
  return 1;
}